

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsDQJtimes(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *arkode_mem,
                 N_Vector work)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double dVar1;
  int retval;
  int iter;
  sunrealtype siginv;
  sunrealtype sig;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  int local_68;
  int local_64;
  ARKLsMem *in_stack_ffffffffffffffa0;
  ARKodeMem *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  int local_4;
  
  local_4 = arkLs_AccessARKODELMem
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                       ,in_stack_ffffffffffffffa0);
  if (local_4 == 0) {
    dVar1 = (double)N_VWrmsNorm(in_RDI,*(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x230));
    dVar1 = 1.0 / dVar1;
    local_68 = 0;
    for (local_64 = 0; local_64 < 3; local_64 = local_64 + 1) {
      N_VLinearSum(dVar1,0x3ff0000000000000,in_RDI,in_RDX,in_R9);
      local_68 = (**(code **)(in_stack_ffffffffffffffb0 + 0x108))
                           (in_XMM0_Qa,in_R9,in_RSI,
                            *(undefined8 *)((long)in_stack_ffffffffffffffb8 + 0x10));
      *(long *)(in_stack_ffffffffffffffb0 + 0x88) = *(long *)(in_stack_ffffffffffffffb0 + 0x88) + 1;
      if (local_68 == 0) break;
      if (local_68 < 0) {
        return -1;
      }
      dVar1 = dVar1 * 0.25;
    }
    if (local_68 < 1) {
      N_VLinearSum(1.0 / dVar1,-(1.0 / dVar1),in_RSI,in_RCX,in_RSI);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int arkLsDQJtimes(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                  N_Vector fy, void* arkode_mem, N_Vector work)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  sunrealtype sig, siginv;
  int iter, retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Initialize perturbation to 1/||v|| */
  sig = ONE / N_VWrmsNorm(v, ark_mem->ewt);

  for (iter = 0; iter < MAX_DQITERS; iter++)
  {
    /* Set work = y + sig*v */
    N_VLinearSum(sig, v, ONE, y, work);

    /* Set Jv = f(tn, y+sig*v) */
    retval = arkls_mem->Jt_f(t, work, Jv, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    /* If fi failed recoverably, shrink sig and retry */
    sig *= PT25;
  }

  /* If retval still isn't 0, return with a recoverable failure */
  if (retval > 0) { return (+1); }

  /* Replace Jv by (Jv - fy)/sig */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, fy, Jv);

  return (0);
}